

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaBlockVector::CommitAllocationRequest
          (VmaBlockVector *this,VmaAllocationRequest *allocRequest,VmaDeviceMemoryBlock *pBlock,
          VkDeviceSize alignment,VmaAllocationCreateFlags allocFlags,void *pUserData,
          VmaSuballocationType suballocType,VmaAllocation *pAllocation)

{
  uint uVar1;
  uint uVar2;
  VmaAllocation pVVar3;
  VkDeviceSize in_RCX;
  VkDeviceSize allocOffset;
  VmaAllocator in_RDX;
  VmaDeviceMemoryBlock *in_RSI;
  VmaAllocator in_RDI;
  uint in_R8D;
  void *in_R9;
  bool bVar4;
  VmaSuballocationType in_stack_00000008;
  undefined8 *in_stack_00000010;
  VkResult res_1;
  VkResult res;
  bool isMappingAllowed;
  bool isUserDataString;
  bool mapped;
  undefined4 in_stack_ffffffffffffff94;
  VmaAllocator in_stack_ffffffffffffff98;
  uint32_t heapIndex;
  VmaCurrentBudgetData *in_stack_ffffffffffffffa0;
  VkDeviceSize allocSize;
  bool *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd0;
  VkResult local_4;
  
  bVar4 = (in_R8D & 4) != 0;
  uVar1 = in_R8D & 0x20;
  VmaDeviceMemoryBlock::PostAlloc((VmaDeviceMemoryBlock *)0x2f7060);
  if ((!bVar4) ||
     (local_4 = VmaDeviceMemoryBlock::Map
                          (in_RSI,in_RDX,(uint32_t)(in_RCX >> 0x20),
                           (void **)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)),
     local_4 == VK_SUCCESS)) {
    pVVar3 = VmaAllocationObjectAllocator::Allocate<bool_const&>
                       ((VmaAllocationObjectAllocator *)in_RDI,in_stack_ffffffffffffffa8);
    *in_stack_00000010 = pVVar3;
    (**(code **)(**(long **)in_RDX + 0x98))
              (*(long **)in_RDX,in_RSI,in_stack_00000008,*in_stack_00000010);
    uVar2 = (uint)bVar4;
    VmaAllocation_T::InitBlockAllocation
              ((VmaAllocation_T *)*in_stack_00000010,(VmaDeviceMemoryBlock *)in_RDX,
               (VmaAllocHandle)in_RSI->m_pMetadata,in_RCX,(VkDeviceSize)in_RSI->m_hParentPool,
               *(uint32_t *)&in_RDI->m_hDevice,in_stack_00000008,bVar4);
    if (uVar1 == 0) {
      VmaAllocation_T::SetUserData
                ((VmaAllocation_T *)*in_stack_00000010,*(VmaAllocator *)in_RDI,in_R9);
      heapIndex = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    }
    else {
      VmaAllocation_T::SetName
                ((VmaAllocation_T *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
      heapIndex = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    }
    allocOffset = *(long *)in_RDI + 0x1210;
    VmaAllocator_T::MemoryTypeIndexToHeapIndex
              (*(VmaAllocator_T **)in_RDI,*(uint32_t *)&in_RDI->m_hDevice);
    VmaCurrentBudgetData::AddAllocation
              (in_stack_ffffffffffffffa0,heapIndex,CONCAT44(in_stack_ffffffffffffff94,uVar2));
    bVar4 = IsCorruptionDetectionEnabled((VmaBlockVector *)in_RDI);
    if (bVar4) {
      allocSize._0_1_ = in_RDI->m_UseMutex;
      allocSize._1_3_ = *(undefined3 *)&in_RDI->field_0x1;
      allocSize._4_4_ = in_RDI->m_VulkanApiVersion;
      VmaAllocation_T::GetOffset((VmaAllocation_T *)in_RDX);
      VmaDeviceMemoryBlock::WriteMagicValueAfterAllocation
                ((VmaDeviceMemoryBlock *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,allocOffset,
                 allocSize);
    }
    local_4 = VK_SUCCESS;
  }
  return local_4;
}

Assistant:

VkResult VmaBlockVector::CommitAllocationRequest(
    VmaAllocationRequest& allocRequest,
    VmaDeviceMemoryBlock* pBlock,
    VkDeviceSize alignment,
    VmaAllocationCreateFlags allocFlags,
    void* pUserData,
    VmaSuballocationType suballocType,
    VmaAllocation* pAllocation)
{
    const bool mapped = (allocFlags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0;
    const bool isUserDataString = (allocFlags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0;
    const bool isMappingAllowed = (allocFlags &
        (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0;

    pBlock->PostAlloc();
    // Allocate from pCurrBlock.
    if (mapped)
    {
        VkResult res = pBlock->Map(m_hAllocator, 1, VMA_NULL);
        if (res != VK_SUCCESS)
        {
            return res;
        }
    }

    *pAllocation = m_hAllocator->m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    pBlock->m_pMetadata->Alloc(allocRequest, suballocType, *pAllocation);
    (*pAllocation)->InitBlockAllocation(
        pBlock,
        allocRequest.allocHandle,
        alignment,
        allocRequest.size, // Not size, as actual allocation size may be larger than requested!
        m_MemoryTypeIndex,
        suballocType,
        mapped);
    VMA_HEAVY_ASSERT(pBlock->Validate());
    if (isUserDataString)
        (*pAllocation)->SetName(m_hAllocator, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(m_hAllocator, pUserData);
    m_hAllocator->m_Budget.AddAllocation(m_hAllocator->MemoryTypeIndexToHeapIndex(m_MemoryTypeIndex), allocRequest.size);
    if (VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        m_hAllocator->FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }
    if (IsCorruptionDetectionEnabled())
    {
        VkResult res = pBlock->WriteMagicValueAfterAllocation(m_hAllocator, (*pAllocation)->GetOffset(), allocRequest.size);
        VMA_ASSERT(res == VK_SUCCESS && "Couldn't map block memory to write magic value.");
    }
    return VK_SUCCESS;
}